

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_cmpi_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar2 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  uVar1 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  uVar2 = OPER_AW_32();
  m68ki_cpu.not_z_flag = uVar2 - uVar1;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.v_flag = ((m68ki_cpu.not_z_flag ^ uVar2) & (uVar2 ^ uVar1)) >> 0x18;
  m68ki_cpu.c_flag =
       ((m68ki_cpu.not_z_flag | uVar1) & ~uVar2 | m68ki_cpu.not_z_flag & uVar1) >> 0x17;
  return;
}

Assistant:

static void m68k_op_cmpi_32_aw(void)
{
	uint src = OPER_I_32();
	uint dst = OPER_AW_32();
	uint res = dst - src;

	FLAG_N = NFLAG_32(res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);
	FLAG_V = VFLAG_SUB_32(src, dst, res);
	FLAG_C = CFLAG_SUB_32(src, dst, res);
}